

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_copy(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  _func_void_void_ptr *p_Var2;
  jx9_io_stream *pStream;
  void *pvVar3;
  jx9_io_stream *pStream_00;
  void *pvVar4;
  jx9_int64 jVar5;
  char *pcVar6;
  jx9_value *pjVar7;
  jx9_vm *pjVar8;
  char *zFile;
  int nLen;
  char zBuf [8192];
  
  if (((nArg < 2) || (((*apArg)->iFlags & 1) == 0)) || ((apArg[1]->iFlags & 1) == 0)) {
    pjVar1 = pCtx->pFunc;
    pjVar8 = pCtx->pVm;
    pcVar6 = "Expecting a source and a destination path";
LAB_0013db4c:
    jx9VmThrowError(pjVar8,&pjVar1->sName,2,pcVar6);
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pjVar8 = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pjVar8,&zFile,nLen);
    pcVar6 = zFile;
    if (pStream == (jx9_io_stream *)0x0) {
      pjVar1 = pCtx->pFunc;
      pcVar6 = "No such stream device, JX9 is returning FALSE";
      goto LAB_0013db4c;
    }
    if (nArg == 2) {
      pjVar7 = (jx9_value *)0x0;
    }
    else {
      pjVar7 = apArg[2];
    }
    pvVar3 = jx9StreamOpenHandle(pjVar8,pStream,zFile,1,0,pjVar7,0,(int *)0x0);
    if (pvVar3 != (void *)0x0) {
      zFile = jx9_value_to_string(apArg[1],&nLen);
      pjVar8 = pCtx->pVm;
      pStream_00 = jx9VmGetStreamDevice(pjVar8,&zFile,nLen);
      pcVar6 = zFile;
      if (pStream_00 == (jx9_io_stream *)0x0) {
        jx9VmThrowError(pjVar8,&pCtx->pFunc->sName,2,"No such stream device, JX9 is returning FALSE"
                       );
      }
      else {
        if (pStream_00->xWrite != (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
          if (nArg == 2) {
            pjVar7 = (jx9_value *)0x0;
          }
          else {
            pjVar7 = apArg[2];
          }
          pvVar4 = jx9StreamOpenHandle(pjVar8,pStream_00,zFile,0x1c,0,pjVar7,0,(int *)0x0);
          if (pvVar4 == (void *)0x0) {
            jx9_context_throw_error_format
                      (pCtx,1,"IO error while opening destination: \'%s\'",pcVar6);
            pjVar7 = pCtx->pRet;
            jx9MemObjRelease(pjVar7);
            (pjVar7->x).rVal = 0.0;
            pjVar7->iFlags = pjVar7->iFlags & 0xfffffe90U | 8;
            p_Var2 = pStream->xClose;
            goto joined_r0x0013dce2;
          }
          do {
            jVar5 = (*pStream->xRead)(pvVar3,zBuf,0x2000);
            if (jVar5 < 1) break;
            jVar5 = (*pStream_00->xWrite)(pvVar4,zBuf,jVar5);
          } while (0 < jVar5);
          if (pStream->xClose != (_func_void_void_ptr *)0x0) {
            (*pStream->xClose)(pvVar3);
          }
          if (pStream_00->xClose != (_func_void_void_ptr *)0x0) {
            (*pStream_00->xClose)(pvVar4);
          }
          pjVar7 = pCtx->pRet;
          jx9MemObjRelease(pjVar7);
          (pjVar7->x).rVal = 4.94065645841247e-324;
          goto LAB_0013db69;
        }
        jx9_context_throw_error_format
                  (pCtx,2,
                   "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                   ,(pCtx->pFunc->sName).zString,pStream->zName);
      }
      pjVar7 = pCtx->pRet;
      jx9MemObjRelease(pjVar7);
      (pjVar7->x).rVal = 0.0;
      pjVar7->iFlags = pjVar7->iFlags & 0xfffffe90U | 8;
      p_Var2 = pStream->xClose;
joined_r0x0013dce2:
      if (p_Var2 == (_func_void_void_ptr *)0x0) {
        return 0;
      }
      (*p_Var2)(pvVar3);
      return 0;
    }
    jx9_context_throw_error_format(pCtx,1,"IO error while opening source: \'%s\'",pcVar6);
  }
  pjVar7 = pCtx->pRet;
  jx9MemObjRelease(pjVar7);
  (pjVar7->x).rVal = 0.0;
LAB_0013db69:
  pjVar7->iFlags = pjVar7->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_copy(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pSin, *pSout;	
	const char *zFile;
	char zBuf[8192];
	void *pIn, *pOut;
	jx9_int64 n;
	int nLen;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_string(apArg[1])){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a source and a destination path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the source name */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pSin = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pSin == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Try to open the source file in a read-only mode */
	pIn = jx9StreamOpenHandle(pCtx->pVm, pSin, zFile, JX9_IO_OPEN_RDONLY, FALSE, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pIn == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening source: '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the destination name */
	zFile = jx9_value_to_string(apArg[1], &nLen);
	/* Point to the target IO stream device */
	pSout = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pSout == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		jx9StreamCloseHandle(pSin, pIn);
		return JX9_OK;
	}
	if( pSout->xWrite == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pSin->zName
			);
		jx9_result_bool(pCtx, 0);
		jx9StreamCloseHandle(pSin, pIn);
		return JX9_OK;
	}
	/* Try to open the destination file in a read-write mode */
	pOut = jx9StreamOpenHandle(pCtx->pVm, pSout, zFile, 
		JX9_IO_OPEN_CREATE|JX9_IO_OPEN_TRUNC|JX9_IO_OPEN_RDWR, FALSE, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pOut == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening destination: '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		jx9StreamCloseHandle(pSin, pIn);
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		/* Read from source */
		n = pSin->xRead(pIn, zBuf, sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error, break immediately */
			break;
		}
		/* Write to dest */
		n = pSout->xWrite(pOut, zBuf, n);
		if( n < 1 ){
			/* IO error, break immediately */
			break;
		}
	}
	/* Close the streams */
	jx9StreamCloseHandle(pSin, pIn);
	jx9StreamCloseHandle(pSout, pOut);
	/* Return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}